

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

void __thiscall DIntermissionScreenScroller::Drawer(DIntermissionScreenScroller *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  FTexture *img;
  FTexture *this_00;
  double dVar4;
  double y;
  double local_58;
  double local_48;
  
  uVar2 = (this->mFirstPic).texnum;
  if (uVar2 < TexMan.Textures.Count) {
    this_00 = TexMan.Textures.Array[(int)uVar2].Texture;
  }
  else {
    this_00 = (FTexture *)0x0;
  }
  uVar2 = (this->mSecondPic).texnum;
  if (uVar2 < TexMan.Textures.Count) {
    img = TexMan.Textures.Array[(int)uVar2].Texture;
  }
  else {
    img = (FTexture *)0x0;
  }
  iVar1 = (this->super_DIntermissionScreen).mTicker;
  if ((((iVar1 < this->mScrollDelay) || (img == (FTexture *)0x0)) || (this_00 == (FTexture *)0x0))
     || (this->mScrollDelay + this->mScrollTime <= iVar1)) {
    DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
    return;
  }
  uVar2 = FTexture::GetScaledWidth(this_00);
  uVar3 = FTexture::GetScaledHeight(this_00);
  iVar1 = this->mScrollDir;
  dVar4 = (double)((this->super_DIntermissionScreen).mTicker - this->mScrollDelay);
  if (iVar1 == 1) {
    dVar4 = (-(double)(int)uVar2 * dVar4) / (double)this->mScrollTime;
    local_58 = (double)(int)uVar2 + dVar4;
    y = 0.0;
    local_48 = 0.0;
  }
  else {
    if (iVar1 == 3) {
      y = (-(double)(int)uVar3 * dVar4) / (double)this->mScrollTime;
      local_48 = (double)(int)uVar3 + y;
    }
    else {
      if (iVar1 != 2) {
        dVar4 = (dVar4 * (double)(int)uVar2) / (double)this->mScrollTime;
        local_58 = dVar4 - (double)(int)uVar2;
        local_48 = 0.0;
        y = 0.0;
        goto LAB_00327446;
      }
      y = (dVar4 * (double)(int)uVar3) / (double)this->mScrollTime;
      local_48 = y - (double)(int)uVar3;
    }
    dVar4 = 0.0;
    local_58 = 0.0;
  }
LAB_00327446:
  DCanvas::DrawTexture
            ((DCanvas *)screen,this_00,dVar4,y,0x40001399,(ulong)uVar2,0x4000139a,(ulong)uVar3,
             0x400013a5,0,0);
  DCanvas::DrawTexture
            ((DCanvas *)screen,img,local_58,local_48,0x40001399,(ulong)uVar2,0x4000139a,(ulong)uVar3
             ,0x400013a5,0,0);
  DCanvas::FillBorder((DCanvas *)screen,(FTexture *)0x0);
  (this->super_DIntermissionScreen).mBackground.texnum = (this->mSecondPic).texnum;
  return;
}

Assistant:

void DIntermissionScreenScroller::Drawer ()
{
	FTexture *tex = TexMan[mFirstPic];
	FTexture *tex2 = TexMan[mSecondPic];
	if (mTicker >= mScrollDelay && mTicker < mScrollDelay + mScrollTime && tex != NULL && tex2 != NULL)
	{

		int fwidth = tex->GetScaledWidth();
		int fheight = tex->GetScaledHeight();

		double xpos1 = 0, ypos1 = 0, xpos2 = 0, ypos2 = 0;

		switch (mScrollDir)
		{
		case SCROLL_Up:
			ypos1 = double(mTicker - mScrollDelay) * fheight / mScrollTime;
			ypos2 = ypos1 - fheight;
			break;

		case SCROLL_Down:
			ypos1 = -double(mTicker - mScrollDelay) * fheight / mScrollTime;
			ypos2 = ypos1 + fheight;
			break;

		case SCROLL_Left:
		default:
			xpos1 = double(mTicker - mScrollDelay) * fwidth / mScrollTime;
			xpos2 = xpos1 - fwidth;
			break;

		case SCROLL_Right:
			xpos1 = -double(mTicker - mScrollDelay) * fwidth / mScrollTime;
			xpos2 = xpos1 + fwidth;
			break;
		}

		screen->DrawTexture (tex, xpos1, ypos1,
			DTA_VirtualWidth, fwidth,
			DTA_VirtualHeight, fheight,
			DTA_Masked, false,
			TAG_DONE);
		screen->DrawTexture (tex2, xpos2, ypos2,
			DTA_VirtualWidth, fwidth,
			DTA_VirtualHeight, fheight,
			DTA_Masked, false,
			TAG_DONE);

		screen->FillBorder (NULL);
		mBackground = mSecondPic;
	}
	else 
	{
		Super::Drawer();
	}
}